

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

string * __thiscall
glcts::PipelineStatisticsQueryUtilities::getStringForEnum_abi_cxx11_
          (string *__return_storage_ptr__,PipelineStatisticsQueryUtilities *this,GLenum value)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[?]","");
  switch((int)this) {
  case 0x82ee:
    pcVar1 = "GL_VERTICES_SUBMITTED_ARB";
    break;
  case 0x82ef:
    pcVar1 = "GL_PRIMITIVES_SUBMITTED_ARB";
    break;
  case 0x82f0:
    pcVar1 = "GL_VERTEX_SHADER_INVOCATIONS_ARB";
    break;
  case 0x82f1:
    pcVar1 = "GL_TESS_CONTROL_SHADER_PATCHES_ARB";
    break;
  case 0x82f2:
    pcVar1 = "GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB";
    break;
  case 0x82f3:
    pcVar1 = "GL_GEOMETRY_SHADER_PRIMITIVES_EMITTED_ARB";
    break;
  case 0x82f4:
    pcVar1 = "GL_FRAGMENT_SHADER_INVOCATIONS_ARB";
    break;
  case 0x82f5:
    pcVar1 = "GL_COMPUTE_SHADER_INVOCATIONS_ARB";
    break;
  case 0x82f6:
    pcVar1 = "GL_CLIPPING_INPUT_PRIMITIVES_ARB";
    break;
  case 0x82f7:
    pcVar1 = "GL_CLIPPING_OUTPUT_PRIMITIVES_ARB";
    break;
  default:
    if ((int)this != 0x887f) {
      return __return_storage_ptr__;
    }
    pcVar1 = "GL_GEOMETRY_SHADER_INVOCATIONS";
  }
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string PipelineStatisticsQueryUtilities::getStringForEnum(glw::GLenum value)
{
	std::string result = "[?]";

	switch (value)
	{
	case GL_CLIPPING_INPUT_PRIMITIVES_ARB:
		result = "GL_CLIPPING_INPUT_PRIMITIVES_ARB";
		break;
	case GL_CLIPPING_OUTPUT_PRIMITIVES_ARB:
		result = "GL_CLIPPING_OUTPUT_PRIMITIVES_ARB";
		break;
	case GL_COMPUTE_SHADER_INVOCATIONS_ARB:
		result = "GL_COMPUTE_SHADER_INVOCATIONS_ARB";
		break;
	case GL_FRAGMENT_SHADER_INVOCATIONS_ARB:
		result = "GL_FRAGMENT_SHADER_INVOCATIONS_ARB";
		break;
	case GL_GEOMETRY_SHADER_INVOCATIONS:
		result = "GL_GEOMETRY_SHADER_INVOCATIONS";
		break;
	case GL_GEOMETRY_SHADER_PRIMITIVES_EMITTED_ARB:
		result = "GL_GEOMETRY_SHADER_PRIMITIVES_EMITTED_ARB";
		break;
	case GL_PRIMITIVES_SUBMITTED_ARB:
		result = "GL_PRIMITIVES_SUBMITTED_ARB";
		break;
	case GL_TESS_CONTROL_SHADER_PATCHES_ARB:
		result = "GL_TESS_CONTROL_SHADER_PATCHES_ARB";
		break;
	case GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB:
		result = "GL_TESS_EVALUATION_SHADER_INVOCATIONS_ARB";
		break;
	case GL_VERTEX_SHADER_INVOCATIONS_ARB:
		result = "GL_VERTEX_SHADER_INVOCATIONS_ARB";
		break;
	case GL_VERTICES_SUBMITTED_ARB:
		result = "GL_VERTICES_SUBMITTED_ARB";
		break;
	} /* switch (value) */

	return result;
}